

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::InstanceIntersectorK<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  NodeRef nodeRef;
  long lVar18;
  undefined1 (*pauVar19) [32];
  ulong *puVar20;
  ulong uVar21;
  Primitive *prim;
  bool bVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar44 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  vbool<8>_conflict valid0;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  vbool<8>_conflict local_594b;
  InstanceIntersectorK<8> local_594a;
  Precalculations local_5949;
  undefined4 local_5948;
  uint local_5944;
  ulong local_5940;
  RayK<8> *local_5938;
  RayK<8> *local_5930;
  ulong local_5928;
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  uVar21 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar21 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar29 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      uVar24 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40),5);
      uVar23 = vpcmpeqd_avx512vl(auVar29,(undefined1  [32])valid_i->field_0);
      uVar24 = uVar24 & uVar23;
      bVar17 = (byte)uVar24;
      if (bVar17 != 0) {
        auVar29 = *(undefined1 (*) [32])(ray + 0x80);
        auVar26 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar27 = *(undefined1 (*) [32])(ray + 0xc0);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar42 = ZEXT3264(local_4680);
        local_5938 = ray + 0x100;
        local_5948 = (undefined4)uVar24;
        auVar25 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
        local_58c0._0_4_ =
             (uint)(bVar17 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar17 & 1) * 0x7f800000;
        bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
        local_58c0._4_4_ = (uint)bVar22 * auVar25._4_4_ | (uint)!bVar22 * 0x7f800000;
        bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
        local_58c0._8_4_ = (uint)bVar22 * auVar25._8_4_ | (uint)!bVar22 * 0x7f800000;
        bVar22 = (bool)((byte)(uVar24 >> 3) & 1);
        local_58c0._12_4_ = (uint)bVar22 * auVar25._12_4_ | (uint)!bVar22 * 0x7f800000;
        bVar22 = (bool)((byte)(uVar24 >> 4) & 1);
        local_58c0._16_4_ = (uint)bVar22 * auVar25._16_4_ | (uint)!bVar22 * 0x7f800000;
        bVar22 = (bool)((byte)(uVar24 >> 5) & 1);
        local_58c0._20_4_ = (uint)bVar22 * auVar25._20_4_ | (uint)!bVar22 * 0x7f800000;
        bVar22 = (bool)((byte)(uVar24 >> 6) & 1);
        local_58c0._24_4_ = (uint)bVar22 * auVar25._24_4_ | (uint)!bVar22 * 0x7f800000;
        bVar22 = SUB81(uVar24 >> 7,0);
        local_58c0._28_4_ = (uint)bVar22 * auVar25._28_4_ | (uint)!bVar22 * 0x7f800000;
        auVar43 = ZEXT3264(local_58c0);
        auVar25 = *(undefined1 (*) [32])(ray + 0x20);
        auVar28 = *(undefined1 (*) [32])(ray + 0x40);
        auVar30._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
        auVar30._8_4_ = auVar28._8_4_ ^ 0x80000000;
        auVar30._12_4_ = auVar28._12_4_ ^ 0x80000000;
        auVar30._16_4_ = auVar28._16_4_ ^ 0x80000000;
        auVar30._20_4_ = auVar28._20_4_ ^ 0x80000000;
        auVar30._24_4_ = auVar28._24_4_ ^ 0x80000000;
        auVar30._28_4_ = auVar28._28_4_ ^ 0x80000000;
        uVar23 = (ulong)(byte)~bVar17;
        local_5810 = 0xfffffffffffffff8;
        local_5808[0] = uVar21;
        local_4660 = local_58c0;
        if (uVar21 != 0xfffffffffffffff8) {
          auVar33._8_4_ = 0x7fffffff;
          auVar33._0_8_ = 0x7fffffff7fffffff;
          auVar33._12_4_ = 0x7fffffff;
          auVar33._16_4_ = 0x7fffffff;
          auVar33._20_4_ = 0x7fffffff;
          auVar33._24_4_ = 0x7fffffff;
          auVar33._28_4_ = 0x7fffffff;
          auVar28 = vandps_avx(auVar29,auVar33);
          auVar36._8_4_ = 0x219392ef;
          auVar36._0_8_ = 0x219392ef219392ef;
          auVar36._12_4_ = 0x219392ef;
          auVar36._16_4_ = 0x219392ef;
          auVar36._20_4_ = 0x219392ef;
          auVar36._24_4_ = 0x219392ef;
          auVar36._28_4_ = 0x219392ef;
          uVar10 = vcmpps_avx512vl(auVar28,auVar36,1);
          bVar22 = (bool)((byte)uVar10 & 1);
          auVar28._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar29._0_4_;
          bVar22 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar28._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar29._4_4_;
          bVar22 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar28._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar29._8_4_;
          bVar22 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar28._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar29._12_4_;
          bVar22 = (bool)((byte)(uVar10 >> 4) & 1);
          auVar28._16_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar29._16_4_;
          bVar22 = (bool)((byte)(uVar10 >> 5) & 1);
          auVar28._20_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar29._20_4_;
          bVar22 = (bool)((byte)(uVar10 >> 6) & 1);
          auVar28._24_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar29._24_4_;
          bVar22 = SUB81(uVar10 >> 7,0);
          auVar28._28_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar29._28_4_;
          auVar29 = vandps_avx(auVar26,auVar33);
          uVar10 = vcmpps_avx512vl(auVar29,auVar36,1);
          bVar22 = (bool)((byte)uVar10 & 1);
          auVar31._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar26._0_4_;
          bVar22 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar31._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar26._4_4_;
          bVar22 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar31._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar26._8_4_;
          bVar22 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar31._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar26._12_4_;
          bVar22 = (bool)((byte)(uVar10 >> 4) & 1);
          auVar31._16_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar26._16_4_;
          bVar22 = (bool)((byte)(uVar10 >> 5) & 1);
          auVar31._20_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar26._20_4_;
          bVar22 = (bool)((byte)(uVar10 >> 6) & 1);
          auVar31._24_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar26._24_4_;
          bVar22 = SUB81(uVar10 >> 7,0);
          auVar31._28_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar26._28_4_;
          auVar29 = vandps_avx(auVar27,auVar33);
          uVar10 = vcmpps_avx512vl(auVar29,auVar36,1);
          bVar22 = (bool)((byte)uVar10 & 1);
          auVar29._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._0_4_;
          bVar22 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar29._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._4_4_;
          bVar22 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar29._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._8_4_;
          bVar22 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar29._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._12_4_;
          bVar22 = (bool)((byte)(uVar10 >> 4) & 1);
          auVar29._16_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._16_4_;
          bVar22 = (bool)((byte)(uVar10 >> 5) & 1);
          auVar29._20_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._20_4_;
          bVar22 = (bool)((byte)(uVar10 >> 6) & 1);
          auVar29._24_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._24_4_;
          bVar22 = SUB81(uVar10 >> 7,0);
          auVar29._28_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar27._28_4_;
          auVar26 = vrcp14ps_avx512vl(auVar28);
          auVar34._8_4_ = 0x3f800000;
          auVar34._0_8_ = 0x3f8000003f800000;
          auVar34._12_4_ = 0x3f800000;
          auVar34._16_4_ = 0x3f800000;
          auVar34._20_4_ = 0x3f800000;
          auVar34._24_4_ = 0x3f800000;
          auVar34._28_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar28,auVar26,auVar34);
          auVar27 = vrcp14ps_avx512vl(auVar31);
          auVar15 = vfnmadd213ps_fma(auVar31,auVar27,auVar34);
          auVar28 = vrcp14ps_avx512vl(auVar29);
          auVar16 = vfnmadd213ps_fma(auVar29,auVar28,auVar34);
          auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar27,auVar27);
          auVar40 = ZEXT1664(auVar15);
          auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar26,auVar26);
          auVar39 = ZEXT1664(auVar14);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar28,auVar28);
          auVar41 = ZEXT1664(auVar16);
          puVar20 = local_5808;
          auVar44._0_4_ = auVar14._0_4_ * -*(float *)ray;
          auVar44._4_4_ = auVar14._4_4_ * -*(float *)(ray + 4);
          auVar44._8_4_ = auVar14._8_4_ * -*(float *)(ray + 8);
          auVar44._12_4_ = auVar14._12_4_ * -*(float *)(ray + 0xc);
          auVar44._16_4_ = -*(float *)(ray + 0x10) * 0.0;
          auVar44._20_4_ = -*(float *)(ray + 0x14) * 0.0;
          auVar44._28_36_ = in_ZMM14._28_36_;
          auVar44._24_4_ = -*(float *)(ray + 0x18) * 0.0;
          local_58e0 = auVar44._0_32_;
          auVar44 = ZEXT3264(local_58e0);
          auVar45._0_4_ = auVar15._0_4_ * -auVar25._0_4_;
          auVar45._4_4_ = auVar15._4_4_ * -auVar25._4_4_;
          auVar45._8_4_ = auVar15._8_4_ * -auVar25._8_4_;
          auVar45._12_4_ = auVar15._12_4_ * -auVar25._12_4_;
          auVar45._16_4_ = -auVar25._16_4_ * 0.0;
          auVar45._20_4_ = -auVar25._20_4_ * 0.0;
          auVar45._28_36_ = in_ZMM15._28_36_;
          auVar45._24_4_ = -auVar25._24_4_ * 0.0;
          local_5900 = auVar45._0_32_;
          auVar45 = ZEXT3264(local_5900);
          local_58a0 = ZEXT1632(auVar16);
          local_5920 = vmulps_avx512vl(local_58a0,auVar30);
          auVar46 = ZEXT3264(local_5920);
          auVar29 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar26 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
          bVar3 = (bool)((byte)(uVar24 >> 2) & 1);
          bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
          bVar5 = (bool)((byte)(uVar24 >> 4) & 1);
          bVar6 = (bool)((byte)(uVar24 >> 5) & 1);
          bVar7 = (bool)((byte)(uVar24 >> 6) & 1);
          bVar8 = SUB81(uVar24 >> 7,0);
          auVar47 = ZEXT3264(CONCAT428((uint)bVar8 * auVar26._28_4_ | (uint)!bVar8 * auVar29._28_4_,
                                       CONCAT424((uint)bVar7 * auVar26._24_4_ |
                                                 (uint)!bVar7 * auVar29._24_4_,
                                                 CONCAT420((uint)bVar6 * auVar26._20_4_ |
                                                           (uint)!bVar6 * auVar29._20_4_,
                                                           CONCAT416((uint)bVar5 * auVar26._16_4_ |
                                                                     (uint)!bVar5 * auVar29._16_4_,
                                                                     CONCAT412((uint)bVar4 *
                                                                               auVar26._12_4_ |
                                                                               (uint)!bVar4 *
                                                                               auVar29._12_4_,
                                                                               CONCAT48((uint)bVar3
                                                                                        * auVar26.
                                                  _8_4_ | (uint)!bVar3 * auVar29._8_4_,
                                                  CONCAT44((uint)bVar22 * auVar26._4_4_ |
                                                           (uint)!bVar22 * auVar29._4_4_,
                                                           (uint)(bVar17 & 1) * auVar26._0_4_ |
                                                           (uint)!(bool)(bVar17 & 1) * auVar29._0_4_
                                                          ))))))));
          pauVar19 = (undefined1 (*) [32])local_4640;
          local_5860 = ZEXT1632(auVar14);
          local_5880 = ZEXT1632(auVar15);
          local_5930 = ray;
LAB_007cebd8:
          pauVar1 = pauVar19 + -1;
          auVar32 = ZEXT3264(*pauVar1);
          pauVar19 = pauVar19 + -1;
          local_5840 = auVar47._0_32_;
          uVar11 = vcmpps_avx512vl(*pauVar1,local_5840,1);
          if ((char)uVar11 != '\0') {
            do {
              if ((uVar21 & 8) != 0) {
                if (uVar21 == 0xfffffffffffffff8) goto LAB_007cee33;
                uVar11 = vcmpps_avx512vl(local_5840,auVar32._0_32_,6);
                if ((char)uVar11 != '\0') {
                  local_5944 = (uint)uVar23;
                  bVar17 = (byte)uVar23;
                  local_594b.v = ~bVar17;
                  local_5928 = (ulong)((uint)uVar21 & 0xf) - 8;
                  if (local_5928 == 0) goto LAB_007cee13;
                  prim = (Primitive *)(uVar21 & 0xfffffffffffffff0);
                  local_5940 = 1;
                  goto LAB_007ced75;
                }
                break;
              }
              lVar18 = 0;
              uVar24 = 8;
              auVar29 = auVar42._0_32_;
              do {
                uVar10 = *(ulong *)((uVar21 & 0xfffffffffffffff0) + lVar18 * 8);
                if (uVar10 == 8) {
                  auVar32 = ZEXT3264(auVar29);
                  break;
                }
                uVar2 = *(undefined4 *)(uVar21 + 0x40 + lVar18 * 4);
                auVar26._4_4_ = uVar2;
                auVar26._0_4_ = uVar2;
                auVar26._8_4_ = uVar2;
                auVar26._12_4_ = uVar2;
                auVar26._16_4_ = uVar2;
                auVar26._20_4_ = uVar2;
                auVar26._24_4_ = uVar2;
                auVar26._28_4_ = uVar2;
                auVar15 = vfmadd132ps_fma(auVar26,auVar44._0_32_,auVar39._0_32_);
                uVar2 = *(undefined4 *)(uVar21 + 0x80 + lVar18 * 4);
                auVar27._4_4_ = uVar2;
                auVar27._0_4_ = uVar2;
                auVar27._8_4_ = uVar2;
                auVar27._12_4_ = uVar2;
                auVar27._16_4_ = uVar2;
                auVar27._20_4_ = uVar2;
                auVar27._24_4_ = uVar2;
                auVar27._28_4_ = uVar2;
                auVar14 = vfmadd132ps_fma(auVar27,auVar45._0_32_,auVar40._0_32_);
                uVar2 = *(undefined4 *)(uVar21 + 0xc0 + lVar18 * 4);
                auVar25._4_4_ = uVar2;
                auVar25._0_4_ = uVar2;
                auVar25._8_4_ = uVar2;
                auVar25._12_4_ = uVar2;
                auVar25._16_4_ = uVar2;
                auVar25._20_4_ = uVar2;
                auVar25._24_4_ = uVar2;
                auVar25._28_4_ = uVar2;
                auVar30 = vfmadd132ps_avx512vl(auVar25,auVar46._0_32_,auVar41._0_32_);
                uVar2 = *(undefined4 *)(uVar21 + 0x60 + lVar18 * 4);
                auVar35._4_4_ = uVar2;
                auVar35._0_4_ = uVar2;
                auVar35._8_4_ = uVar2;
                auVar35._12_4_ = uVar2;
                auVar35._16_4_ = uVar2;
                auVar35._20_4_ = uVar2;
                auVar35._24_4_ = uVar2;
                auVar35._28_4_ = uVar2;
                auVar16 = vfmadd132ps_fma(auVar35,auVar44._0_32_,auVar39._0_32_);
                uVar2 = *(undefined4 *)(uVar21 + 0xa0 + lVar18 * 4);
                auVar37._4_4_ = uVar2;
                auVar37._0_4_ = uVar2;
                auVar37._8_4_ = uVar2;
                auVar37._12_4_ = uVar2;
                auVar37._16_4_ = uVar2;
                auVar37._20_4_ = uVar2;
                auVar37._24_4_ = uVar2;
                auVar37._28_4_ = uVar2;
                auVar13 = vfmadd132ps_fma(auVar37,auVar45._0_32_,auVar40._0_32_);
                uVar2 = *(undefined4 *)(uVar21 + 0xe0 + lVar18 * 4);
                auVar38._4_4_ = uVar2;
                auVar38._0_4_ = uVar2;
                auVar38._8_4_ = uVar2;
                auVar38._12_4_ = uVar2;
                auVar38._16_4_ = uVar2;
                auVar38._20_4_ = uVar2;
                auVar38._24_4_ = uVar2;
                auVar38._28_4_ = uVar2;
                auVar31 = vfmadd132ps_avx512vl(auVar38,auVar46._0_32_,auVar41._0_32_);
                auVar26 = vpminsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar16));
                auVar27 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar13));
                auVar26 = vpmaxsd_avx2(auVar26,auVar27);
                auVar27 = vpminsd_avx2(auVar30,auVar31);
                auVar26 = vpmaxsd_avx2(auVar26,auVar27);
                auVar27 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar16));
                auVar25 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar13));
                auVar28 = vpminsd_avx2(auVar27,auVar25);
                auVar27 = vpmaxsd_avx2(auVar30,auVar31);
                auVar25 = vpmaxsd_avx2(auVar26,auVar43._0_32_);
                auVar27 = vpminsd_avx512vl(auVar27,local_5840);
                auVar27 = vpminsd_avx2(auVar28,auVar27);
                uVar12 = vpcmpd_avx512vl(auVar25,auVar27,2);
                if ((byte)uVar12 == 0) {
                  auVar32 = ZEXT3264(auVar29);
                  uVar10 = uVar24;
                }
                else {
                  auVar27 = vblendmps_avx512vl(auVar42._0_32_,auVar26);
                  bVar22 = (bool)((byte)uVar12 & 1);
                  bVar3 = (bool)((byte)(uVar12 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar12 >> 2) & 1);
                  bVar5 = (bool)((byte)(uVar12 >> 3) & 1);
                  bVar6 = (bool)((byte)(uVar12 >> 4) & 1);
                  bVar7 = (bool)((byte)(uVar12 >> 5) & 1);
                  bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
                  bVar9 = SUB81(uVar12 >> 7,0);
                  auVar32 = ZEXT3264(CONCAT428((uint)bVar9 * auVar27._28_4_ |
                                               (uint)!bVar9 * auVar26._28_4_,
                                               CONCAT424((uint)bVar8 * auVar27._24_4_ |
                                                         (uint)!bVar8 * auVar26._24_4_,
                                                         CONCAT420((uint)bVar7 * auVar27._20_4_ |
                                                                   (uint)!bVar7 * auVar26._20_4_,
                                                                   CONCAT416((uint)bVar6 *
                                                                             auVar27._16_4_ |
                                                                             (uint)!bVar6 *
                                                                             auVar26._16_4_,
                                                                             CONCAT412((uint)bVar5 *
                                                                                       auVar27.
                                                  _12_4_ | (uint)!bVar5 * auVar26._12_4_,
                                                  CONCAT48((uint)bVar4 * auVar27._8_4_ |
                                                           (uint)!bVar4 * auVar26._8_4_,
                                                           CONCAT44((uint)bVar3 * auVar27._4_4_ |
                                                                    (uint)!bVar3 * auVar26._4_4_,
                                                                    (uint)bVar22 * auVar27._0_4_ |
                                                                    (uint)!bVar22 * auVar26._0_4_)))
                                                  )))));
                  if (uVar24 != 8) {
                    *puVar20 = uVar24;
                    puVar20 = puVar20 + 1;
                    *pauVar19 = auVar29;
                    pauVar19 = pauVar19 + 1;
                  }
                }
                uVar24 = uVar10;
                lVar18 = lVar18 + 1;
                auVar29 = auVar32._0_32_;
              } while (lVar18 != 8);
              uVar21 = uVar24;
            } while (uVar24 != 8);
          }
          goto LAB_007ced0d;
        }
LAB_007cee33:
        local_5948._0_1_ = (byte)uVar23 & (byte)local_5948;
        bVar22 = (bool)((byte)local_5948 >> 1 & 1);
        bVar3 = (bool)((byte)local_5948 >> 2 & 1);
        bVar4 = (bool)((byte)local_5948 >> 3 & 1);
        bVar5 = (bool)((byte)local_5948 >> 4 & 1);
        bVar6 = (bool)((byte)local_5948 >> 5 & 1);
        bVar7 = (bool)((byte)local_5948 >> 6 & 1);
        *(uint *)local_5938 =
             (uint)((byte)local_5948 & 1) * -0x800000 |
             (uint)!(bool)((byte)local_5948 & 1) * *(int *)local_5938;
        *(uint *)(local_5938 + 4) =
             (uint)bVar22 * -0x800000 | (uint)!bVar22 * *(int *)(local_5938 + 4);
        *(uint *)(local_5938 + 8) =
             (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(local_5938 + 8);
        *(uint *)(local_5938 + 0xc) =
             (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(local_5938 + 0xc);
        *(uint *)(local_5938 + 0x10) =
             (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_5938 + 0x10);
        *(uint *)(local_5938 + 0x14) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5938 + 0x14);
        *(uint *)(local_5938 + 0x18) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5938 + 0x18);
        *(uint *)(local_5938 + 0x1c) =
             (uint)((byte)local_5948 >> 7) * -0x800000 |
             (uint)!(bool)((byte)local_5948 >> 7) * *(int *)(local_5938 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar22 = local_5928 <= local_5940;
    local_5940 = local_5940 + 1;
    if (bVar22) break;
LAB_007ced75:
    InstanceIntersectorK<8>::occluded(&local_594a,&local_594b,&local_5949,ray,context,prim);
    local_594b.v = ~(byte)local_594a & local_594b.v;
    ray = local_5930;
    if (local_594b.v == 0) break;
  }
  bVar17 = ~local_594b.v;
  uVar23 = (ulong)local_5944;
  auVar39 = ZEXT3264(local_5860);
  auVar40 = ZEXT3264(local_5880);
  auVar41 = ZEXT3264(local_58a0);
  auVar42 = ZEXT3264(CONCAT428(0x7f800000,
                               CONCAT424(0x7f800000,
                                         CONCAT420(0x7f800000,
                                                   CONCAT416(0x7f800000,
                                                             CONCAT412(0x7f800000,
                                                                       CONCAT48(0x7f800000,
                                                                                0x7f8000007f800000))
                                                            )))));
  auVar43 = ZEXT3264(local_58c0);
  auVar44 = ZEXT3264(local_58e0);
  auVar45 = ZEXT3264(local_5900);
  auVar46 = ZEXT3264(local_5920);
LAB_007cee13:
  bVar17 = (byte)uVar23 | bVar17;
  uVar23 = CONCAT71((int7)(uVar23 >> 8),bVar17);
  if (bVar17 == 0xff) {
    uVar23 = 0xff;
    goto LAB_007cee33;
  }
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar22 = (bool)((byte)(uVar23 >> 1) & 1);
  bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
  bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
  bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
  bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
  bVar7 = (bool)((byte)(uVar23 >> 6) & 1);
  bVar8 = (bool)((byte)(uVar23 >> 7) & 1);
  auVar47 = ZEXT3264(CONCAT428((uint)bVar8 * auVar29._28_4_ | (uint)!bVar8 * local_5840._28_4_,
                               CONCAT424((uint)bVar7 * auVar29._24_4_ |
                                         (uint)!bVar7 * local_5840._24_4_,
                                         CONCAT420((uint)bVar6 * auVar29._20_4_ |
                                                   (uint)!bVar6 * local_5840._20_4_,
                                                   CONCAT416((uint)bVar5 * auVar29._16_4_ |
                                                             (uint)!bVar5 * local_5840._16_4_,
                                                             CONCAT412((uint)bVar4 * auVar29._12_4_
                                                                       | (uint)!bVar4 *
                                                                         local_5840._12_4_,
                                                                       CONCAT48((uint)bVar3 *
                                                                                auVar29._8_4_ |
                                                                                (uint)!bVar3 *
                                                                                local_5840._8_4_,
                                                                                CONCAT44((uint)
                                                  bVar22 * auVar29._4_4_ |
                                                  (uint)!bVar22 * local_5840._4_4_,
                                                  (uint)(bVar17 & 1) * auVar29._0_4_ |
                                                  (uint)!(bool)(bVar17 & 1) * local_5840._0_4_))))))
                              ));
LAB_007ced0d:
  uVar21 = puVar20[-1];
  puVar20 = puVar20 + -1;
  if (uVar21 == 0xfffffffffffffff8) goto LAB_007cee33;
  goto LAB_007cebd8;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }